

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pointer __thiscall
google::protobuf::internal::
MapAllocator<std::_Rb_tree_node<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
::allocate(MapAllocator<std::_Rb_tree_node<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
           *this,size_type n,void *param_2)

{
  Arena *this_00;
  size_t n_00;
  pointer pvVar1;
  
  this_00 = this->arena_;
  n_00 = n * 0x28;
  if (this_00 != (Arena *)0x0) {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(this_00,(type_info *)&unsigned_char::typeinfo,n_00);
    }
    pvVar1 = (pointer)Arena::AllocateAlignedNoHook(this_00,n_00);
    return pvVar1;
  }
  pvVar1 = (pointer)operator_new(n_00);
  return pvVar1;
}

Assistant:

pointer allocate(size_type n, const void* /* hint */ = nullptr) {
    // If arena is not given, malloc needs to be called which doesn't
    // construct element object.
    if (arena_ == nullptr) {
      return static_cast<pointer>(::operator new(n * sizeof(value_type)));
    } else {
      return reinterpret_cast<pointer>(
          Arena::CreateArray<uint8>(arena_, n * sizeof(value_type)));
    }
  }